

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigFanout.c
# Opt level: O0

void Fraig_NodeAddFaninFanout(Fraig_Node_t *pFanin,Fraig_Node_t *pFanout)

{
  Fraig_Node_t *pFVar1;
  Fraig_Node_t *pPivot;
  Fraig_Node_t *pFanout_local;
  Fraig_Node_t *pFanin_local;
  
  if (((ulong)pFanin & 1) != 0) {
    __assert_fail("!Fraig_IsComplement(pFanin)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigFanout.c"
                  ,0x32,"void Fraig_NodeAddFaninFanout(Fraig_Node_t *, Fraig_Node_t *)");
  }
  if (((ulong)pFanout & 1) != 0) {
    __assert_fail("!Fraig_IsComplement(pFanout)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigFanout.c"
                  ,0x33,"void Fraig_NodeAddFaninFanout(Fraig_Node_t *, Fraig_Node_t *)");
  }
  if (((Fraig_Node_t *)((ulong)pFanout->p1 & 0xfffffffffffffffe) != pFanin) &&
     ((Fraig_Node_t *)((ulong)pFanout->p2 & 0xfffffffffffffffe) != pFanin)) {
    __assert_fail("Fraig_Regular(pFanout->p1) == pFanin || Fraig_Regular(pFanout->p2) == pFanin",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigFanout.c"
                  ,0x34,"void Fraig_NodeAddFaninFanout(Fraig_Node_t *, Fraig_Node_t *)");
  }
  pFVar1 = pFanin->pFanPivot;
  if (pFVar1 == (Fraig_Node_t *)0x0) {
    pFanin->pFanPivot = pFanout;
  }
  else if ((Fraig_Node_t *)((ulong)pFVar1->p1 & 0xfffffffffffffffe) == pFanin) {
    if ((Fraig_Node_t *)((ulong)pFanout->p1 & 0xfffffffffffffffe) == pFanin) {
      pFanout->pFanFanin1 = pFVar1->pFanFanin1;
      pFVar1->pFanFanin1 = pFanout;
    }
    else {
      pFanout->pFanFanin2 = pFVar1->pFanFanin1;
      pFVar1->pFanFanin1 = pFanout;
    }
  }
  else {
    if ((Fraig_Node_t *)((ulong)pFVar1->p2 & 0xfffffffffffffffe) != pFanin) {
      __assert_fail("Fraig_Regular(pPivot->p2) == pFanin",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigFanout.c"
                    ,0x4c,"void Fraig_NodeAddFaninFanout(Fraig_Node_t *, Fraig_Node_t *)");
    }
    if ((Fraig_Node_t *)((ulong)pFanout->p1 & 0xfffffffffffffffe) == pFanin) {
      pFanout->pFanFanin1 = pFVar1->pFanFanin2;
      pFVar1->pFanFanin2 = pFanout;
    }
    else {
      pFanout->pFanFanin2 = pFVar1->pFanFanin2;
      pFVar1->pFanFanin2 = pFanout;
    }
  }
  return;
}

Assistant:

void Fraig_NodeAddFaninFanout( Fraig_Node_t * pFanin, Fraig_Node_t * pFanout )
{
    Fraig_Node_t * pPivot;

    // pFanins is a fanin of pFanout
    assert( !Fraig_IsComplement(pFanin) );
    assert( !Fraig_IsComplement(pFanout) );
    assert( Fraig_Regular(pFanout->p1) == pFanin || Fraig_Regular(pFanout->p2) == pFanin );

    pPivot = pFanin->pFanPivot;
    if ( pPivot == NULL )
    {
        pFanin->pFanPivot = pFanout;
        return;
    }

    if ( Fraig_Regular(pPivot->p1) == pFanin )
    {
        if ( Fraig_Regular(pFanout->p1) == pFanin )
        {
            pFanout->pFanFanin1 = pPivot->pFanFanin1;
            pPivot->pFanFanin1  = pFanout;
        }
        else // if ( Fraig_Regular(pFanout->p2) == pFanin )
        {
            pFanout->pFanFanin2 = pPivot->pFanFanin1;
            pPivot->pFanFanin1  = pFanout;
        }
    }
    else // if ( Fraig_Regular(pPivot->p2) == pFanin )
    {
        assert( Fraig_Regular(pPivot->p2) == pFanin );
        if ( Fraig_Regular(pFanout->p1) == pFanin )
        {
            pFanout->pFanFanin1 = pPivot->pFanFanin2;
            pPivot->pFanFanin2  = pFanout;
        }
        else // if ( Fraig_Regular(pFanout->p2) == pFanin )
        {
            pFanout->pFanFanin2 = pPivot->pFanFanin2;
            pPivot->pFanFanin2  = pFanout;
        }
    }
}